

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test1<nrg::SyncExecutor>(char *title)

{
  _Invoker_type p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  rep rVar7;
  int local_2ac;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_210;
  allocator<char> local_201;
  string local_200;
  TimedCaller local_1e0;
  int local_1b4;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_1b0;
  int local_1a4;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_1a0;
  int local_194;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_190;
  int local_184;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_180;
  int local_174;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_170;
  int local_164;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_160;
  duration<long,_std::ratio<1L,_1000000000L>_> local_158;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_150;
  duration<long,_std::ratio<1L,_1000000000L>_> local_148;
  type dur;
  duration<long,_std::ratio<1L,_1000L>_> local_138;
  undefined1 local_130 [8];
  AsyncResult<int> ar4;
  time_point t1;
  duration<long,std::ratio<1l,1000l>> local_110 [12];
  undefined1 local_104 [8];
  optional<int> res3;
  int res2;
  int res1;
  AsyncResult<int> ar3;
  AsyncResult<int> ar2;
  AsyncResult<int> ar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_68;
  int local_60 [2];
  int i;
  ExceptionHandler local_50;
  undefined1 local_30 [8];
  Executor<nrg::SyncExecutor> ex;
  char *title_local;
  
  ex.executor_.onError_._M_invoker = (_Invoker_type)title;
  std::function<void(std::exception_const&)>::function<void(&)(std::exception_const&),void>
            ((function<void(std::exception_const&)> *)&local_50,onError);
  nrg::Executor<nrg::SyncExecutor>::Executor((Executor<nrg::SyncExecutor> *)local_30,&local_50);
  std::function<void_(const_std::exception_&)>::~function(&local_50);
  local_60[0] = 0x2a;
  local_68 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  p_Var1 = ex.executor_.onError_._M_invoker;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8," -> start",
             (allocator<char> *)
             ((long)&ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::operator+(&local_88,(char *)p_Var1,&local_a8);
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<std::__cxx11::string>,&local_68,&local_88
            );
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ar1.impl_.
                     super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo1");
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo2");
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo3");
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo4");
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo5");
  local_60[0] = local_60[0] + 1;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print2,local_60,(char (*) [7])"hallo6");
  nrg::Executor<nrg::SyncExecutor>::operator()((Executor<nrg::SyncExecutor> *)local_30,exception);
  nrg::AsyncResult<int>::AsyncResult
            ((AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::AsyncResult
            ((AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::AsyncResult((AsyncResult<int> *)&res1);
  res2 = 0x2a;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,withResult,
             (AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(AsyncResult<int> *)&res1,&res2);
  iVar3 = nrg::AsyncResult<int>::getResult
                    ((AsyncResult<int> *)
                     &ar2.impl_.
                      super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  res3.super__Optional_base<int,_false>.field_0._M_payload = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)
             &res3.super__Optional_base<int,_false>._M_engaged,(int *)&res3);
  iVar4 = nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
                    ((AsyncResult<int> *)
                     &ar3.impl_.
                      super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (duration<long,_std::ratio<1L,_1000L>_> *)
                     &res3.super__Optional_base<int,_false>._M_engaged,0x2b);
  t1.__d.__r._4_4_ = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_110,(int *)((long)&t1.__d.__r + 4));
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            ((AsyncResult<int> *)local_104,(duration<long,_std::ratio<1L,_1000L>_> *)&res1);
  poVar5 = std::operator<<((ostream *)&std::cerr,"ar1: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  poVar5 = std::operator<<(poVar5,",  ar2: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  poVar5 = std::operator<<(poVar5,",  res3: ");
  bVar2 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool((optional *)local_104)
  ;
  if (bVar2) {
    piVar6 = std::experimental::fundamentals_v1::optional<int>::operator*
                       ((optional<int> *)local_104);
    local_2ac = *piVar6;
  }
  else {
    local_2ac = 0;
  }
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2ac);
  std::operator<<(poVar5,"\n");
  ar4.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)now();
  nrg::AsyncResult<int>::AsyncResult((AsyncResult<int> *)local_130);
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,roundTrip,(AsyncResult<int> *)local_130);
  dur.__r._4_4_ = 200;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_138,(int *)((long)&dur.__r + 4));
  nrg::AsyncResult<int>::getResult<long,std::ratio<1l,1000l>>
            ((AsyncResult<int> *)local_130,&local_138,99);
  local_150.__d.__r = (duration)now();
  local_148.__r =
       (rep)std::chrono::operator-
                      (&local_150,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&ar4.impl_.
                           super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
  poVar5 = std::operator<<((ostream *)&std::cout,"ar4 duration: ");
  local_158.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_148);
  rVar7 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_158);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,rVar7);
  std::operator<<(poVar5," ns\n");
  local_160 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_164 = 0xfb;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_160,&local_164);
  local_170 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_174 = 0xfc;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_170,&local_174);
  local_180 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_184 = 0xfd;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_180,&local_184);
  local_190 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_194 = 0xfe;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_190,&local_194);
  local_1a0 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_1a4 = 0xff;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_1a0,&local_1a4);
  local_1b0 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  local_1b4 = 0x100;
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<int>,&local_1b0,&local_1b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"no timeout",&local_201);
  TimedCaller::TimedCaller(&local_1e0,&local_200);
  nrg::Executor<nrg::SyncExecutor>::operator()((Executor<nrg::SyncExecutor> *)local_30,&local_1e0);
  TimedCaller::~TimedCaller(&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  local_210 = std::ref<std::ostream>((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  p_Var1 = ex.executor_.onError_._M_invoker;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250," -> done\n",&local_251);
  std::operator+(&local_230,(char *)p_Var1,&local_250);
  nrg::Executor<nrg::SyncExecutor>::operator()
            ((Executor<nrg::SyncExecutor> *)local_30,print<std::__cxx11::string>,&local_210,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  nrg::AsyncResult<int>::~AsyncResult((AsyncResult<int> *)local_130);
  nrg::AsyncResult<int>::~AsyncResult((AsyncResult<int> *)&res1);
  nrg::AsyncResult<int>::~AsyncResult
            ((AsyncResult<int> *)
             &ar3.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::AsyncResult<int>::~AsyncResult
            ((AsyncResult<int> *)
             &ar2.impl_.super___shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  nrg::Executor<nrg::SyncExecutor>::~Executor((Executor<nrg::SyncExecutor> *)local_30);
  return;
}

Assistant:

void test1(const char* title)
{
    nrg::Executor<ExecutionMode> ex(onError);
    int i = 42;
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> start"));
    ex(print2, ++i, "hallo1");
    ex(print2, ++i, "hallo2");
    ex(print2, ++i, "hallo3");
    ex(print2, ++i, "hallo4");
    ex(print2, ++i, "hallo5");
    ex(print2, ++i, "hallo6");

    ex(exception);

    nrg::AsyncResult<int> ar1;
    nrg::AsyncResult<int> ar2;
    nrg::AsyncResult<int> ar3;

    ex(withResult, ar1, ar2, ar3, 42);
    int res1 = ar1.getResult();
    int res2 = ar2.getResult(std::chrono::milliseconds(0), 43);
    std::experimental::optional<int> res3 = ar3.getResult(std::chrono::milliseconds(0));
    std::cerr <<  "ar1: " <<  res1 << ",  ar2: " << res2 << ",  res3: " << (res3 ? *res3 : 0) << "\n";

    auto t1 = now();

    nrg::AsyncResult<int> ar4;
    ex(roundTrip, ar4);
    ar4.getResult(std::chrono::milliseconds(200), 99);
    auto dur = now()-t1;
    std::cout <<  "ar4 duration: " << std::chrono::duration_cast<std::chrono::nanoseconds>(dur).count() << " ns\n";

    ex(print<int>, std::ref(std::cerr), 251);
    ex(print<int>, std::ref(std::cerr), 252);
    ex(print<int>, std::ref(std::cerr), 253);
    ex(print<int>, std::ref(std::cerr), 254);
    ex(print<int>, std::ref(std::cerr), 255);
    ex(print<int>, std::ref(std::cerr), 256);
    ex(TimedCaller("no timeout"));
    ex(print<std::string>, std::ref(std::cerr), title + std::string(" -> done\n"));

    //std::this_thread::sleep_for(std::chrono::milliseconds(1000));
}